

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Status coda_XML_SetEncoding(XML_Parser parser,XML_Char *encodingName)

{
  XML_Char *pXVar1;
  XML_Char *encodingName_local;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    parser_local._4_4_ = XML_STATUS_ERROR;
  }
  else if (((parser->m_parsingStatus).parsing == XML_PARSING) ||
          ((parser->m_parsingStatus).parsing == XML_SUSPENDED)) {
    parser_local._4_4_ = XML_STATUS_ERROR;
  }
  else {
    (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
    if (encodingName == (XML_Char *)0x0) {
      parser->m_protocolEncodingName = (XML_Char *)0x0;
    }
    else {
      pXVar1 = copyString(encodingName,&parser->m_mem);
      parser->m_protocolEncodingName = pXVar1;
      if (parser->m_protocolEncodingName == (XML_Char *)0x0) {
        return XML_STATUS_ERROR;
      }
    }
    parser_local._4_4_ = XML_STATUS_OK;
  }
  return parser_local._4_4_;
}

Assistant:

enum XML_Status XMLCALL
XML_SetEncoding(XML_Parser parser, const XML_Char *encodingName) {
  if (parser == NULL)
    return XML_STATUS_ERROR;
  /* Block after XML_Parse()/XML_ParseBuffer() has been called.
     XXX There's no way for the caller to determine which of the
     XXX possible error cases caused the XML_STATUS_ERROR return.
  */
  if (parser->m_parsingStatus.parsing == XML_PARSING
      || parser->m_parsingStatus.parsing == XML_SUSPENDED)
    return XML_STATUS_ERROR;

  /* Get rid of any previous encoding name */
  FREE(parser, (void *)parser->m_protocolEncodingName);

  if (encodingName == NULL)
    /* No new encoding name */
    parser->m_protocolEncodingName = NULL;
  else {
    /* Copy the new encoding name into allocated memory */
    parser->m_protocolEncodingName = copyString(encodingName, &(parser->m_mem));
    if (! parser->m_protocolEncodingName)
      return XML_STATUS_ERROR;
  }
  return XML_STATUS_OK;
}